

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::PushScope(cmMakefile *this)

{
  bool bVar1;
  reference ppcVar2;
  cmState *this_00;
  cmGlobalGenerator *this_01;
  cmFileLockPool *this_02;
  Snapshot local_60;
  long local_38;
  long line;
  string commandName;
  cmMakefile *this_local;
  
  commandName.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)&line);
  local_38 = 0;
  bVar1 = std::vector<const_cmCommandContext_*,_std::allocator<const_cmCommandContext_*>_>::empty
                    (&this->ContextStack);
  if (!bVar1) {
    ppcVar2 = std::vector<const_cmCommandContext_*,_std::allocator<const_cmCommandContext_*>_>::back
                        (&this->ContextStack);
    std::__cxx11::string::operator=((string *)&line,(string *)*ppcVar2);
    ppcVar2 = std::vector<const_cmCommandContext_*,_std::allocator<const_cmCommandContext_*>_>::back
                        (&this->ContextStack);
    local_38 = (*ppcVar2)->Line;
  }
  this_00 = GetState(this);
  cmState::CreateVariableScopeSnapshot
            (&local_60,this_00,this->StateSnapshot,(string *)&line,local_38);
  (this->StateSnapshot).Position.Position = local_60.Position.Position;
  (this->StateSnapshot).State = local_60.State;
  (this->StateSnapshot).Position.Tree = local_60.Position.Tree;
  PushLoopBlockBarrier(this);
  this_01 = GetGlobalGenerator(this);
  this_02 = cmGlobalGenerator::GetFileLockPool(this_01);
  cmFileLockPool::PushFunctionScope(this_02);
  std::__cxx11::string::~string((string *)&line);
  return;
}

Assistant:

void cmMakefile::PushScope()
{
  std::string commandName;
  long line = 0;
  if (!this->ContextStack.empty())
    {
    commandName = this->ContextStack.back()->Name;
    line = this->ContextStack.back()->Line;
    }
  this->StateSnapshot = this->GetState()->CreateVariableScopeSnapshot(
        this->StateSnapshot,
        commandName,
        line);
  this->PushLoopBlockBarrier();

#if defined(CMAKE_BUILD_WITH_CMAKE)
  this->GetGlobalGenerator()->GetFileLockPool().PushFunctionScope();
#endif
}